

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O0

int gdImageEmboss(gdImagePtr im)

{
  int iVar1;
  float local_38 [2];
  float filter [3] [3];
  gdImagePtr im_local;
  
  unique0x1000004a = im;
  memset(local_38,0,0x24);
  local_38[0] = 1.5;
  filter[2][0] = -1.5;
  iVar1 = gdImageConvolution(stack0xfffffffffffffff0,(float (*) [3])local_38,1.0,127.0);
  return iVar1;
}

Assistant:

BGD_DECLARE(int) gdImageEmboss(gdImagePtr im)
{
/*
	float filter[3][3] =	{{1.0,1.0,1.0},
				{0.0,0.0,0.0},
				{-1.0,-1.0,-1.0}};
*/
	float filter[3][3] =	{{ 1.5, 0.0, 0.0},
				 { 0.0, 0.0, 0.0},
				 { 0.0, 0.0,-1.5}};

	return gdImageConvolution(im, filter, 1, 127);
}